

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O3

void __thiscall DAGPropagator::findPathFromTo(DAGPropagator *this,int u,int v,vec<Lit> *path)

{
  byte bVar1;
  uint uVar2;
  BoolView *pBVar3;
  uint uVar4;
  pair<int,_int> pair;
  Lit local_54;
  pair<int,_int> local_50;
  vec<Lit> local_48;
  
  uVar4 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
            _vptr_Propagator[0x17])();
  if (uVar4 != 0xffffffff) {
    pBVar3 = (this->super_DReachabilityPropagator).super_GraphPropagator.es.data;
    uVar2 = pBVar3[uVar4].v;
    bVar1 = sat.assigns.data[uVar2];
    if ((bVar1 != 0) && ((uint)pBVar3[uVar4].s * -2 + 1 == (int)(char)bVar1)) {
      local_48.sz = (uint)(bVar1 < 0xfe) + uVar2 * 2;
      vec<Lit>::push(path,(Lit *)&local_48);
      return;
    }
  }
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (Lit *)0x0;
  if (path->sz == 1) {
    vec<Lit>::push(&local_48);
  }
  if (u != v) {
    do {
      local_50.first = 0;
      local_50.second = 0;
      TrailedConstantAccessList<std::pair<int,_int>,_Tint>::get
                (&(this->succs).
                  super__Vector_base<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
                  ._M_impl.super__Vector_impl_data._M_start[u].
                  super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>,v,&local_50);
      uVar4 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x17])(this,(ulong)(uint)u,(ulong)local_50 >> 0x20);
      uVar4 = (this->super_DReachabilityPropagator).super_GraphPropagator.es.data[uVar4].v;
      local_54.x = (uint)((int)sat.assigns.data[uVar4] - 1U < 0xfffffffd) + uVar4 * 2;
      vec<Lit>::push(path,&local_54);
      u = local_50.second;
    } while (local_50.second != v);
  }
  if (local_48.data != (Lit *)0x0) {
    free(local_48.data);
  }
  return;
}

Assistant:

void DAGPropagator::findPathFromTo(int u, int v, vec<Lit>& path) {
	assert(u != v);
	// 1-edge paths:
	const int e = findEdge(u, v);
	if (e != -1 && getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
		path.push(getEdgeVar(e).getValLit());
		return;
	}

	vec<Lit> path2;
	if (path.size() == 1) {
		path2.push();
	}

	int current = u;
	while (current != v) {
		std::pair<int, int> pair;
		const bool ok = succs[current].get(v, &pair);
		assert(ok);
		const edge_id e = findEdge(current, pair.second);
		assert(e != -1);
		assert(getEdgeVar(e).isFixed());
		assert(getEdgeVar(e).isTrue());
		path.push(getEdgeVar(e).getValLit());
		current = pair.second;
	}
	// Longer paths:
	/*
	bool found_v = false;
	stack<node_id> s;
	s.push(u);
	vector<bool> vis = vector<bool>(nbNodes(), false);
	vector<int> parent = vector<int>(nbNodes(), -1);
	parent[u] = u;
	while(!s.empty()) {
			int curr = s.top();
			s.pop();
			vis[curr] = true;
			for (int i = 0; i < ou[curr].size(); i++) {
					int e = ou[curr][i];
					if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isFalse())
							continue;
					int o = getHead(e);
					if (!vis[o]) {
							s.push(o);
							parent[o] = curr;
							if (o == v) {
									found_v = true;
									break;
							}
					}
			}
			if (found_v)
					break;
			assert(!found_v);
	}
	assert(parent[v] != -1);
	assert(found_v);

	int curr = v;
	while (curr != u) {
			int e = findEdge(parent[curr],curr);
			assert(e != -1);
			assert(getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue());
			//cout <<e<<" ";
			path2.push(getEdgeVar(e).getValLit());
			curr = parent[curr];
	}
	assert(path.size() == path2.size());
	*/
}